

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O0

void tf_normalize_filtered_frame
               (MACROBLOCKD *mbd,BLOCK_SIZE block_size,int mb_row,int mb_col,int num_planes,
               uint32_t *accum,uint16_t *count,YV12_BUFFER_CONFIG *result_buffer)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint8_t *puVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int in_ECX;
  int in_EDX;
  byte in_SIL;
  long in_RDI;
  int in_R8D;
  long in_R9;
  long in_stack_00000008;
  YV12_BUFFER_CONFIG *in_stack_00000010;
  uint16_t rounding;
  int idx;
  int j;
  int i;
  int frame_idx;
  int plane_idx;
  uint16_t *buf16;
  uint8_t *buf;
  int frame_offset;
  int frame_stride;
  int plane_w;
  int plane_h;
  int plane;
  int plane_offset;
  int is_high_bitdepth;
  int mb_width;
  int mb_height;
  uint8_t local_7c;
  undefined2 local_74;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_34;
  int local_30;
  
  bVar1 = block_size_high[in_SIL];
  bVar2 = block_size_wide[in_SIL];
  iVar8 = is_frame_high_bitdepth(in_stack_00000010);
  local_30 = 0;
  for (local_34 = 0; local_34 < in_R8D; local_34 = local_34 + 1) {
    iVar9 = (int)(uint)bVar1 >>
            ((byte)*(undefined4 *)(in_RDI + (long)local_34 * 0xa30 + 0x18) & 0x1f);
    iVar10 = (int)(uint)bVar2 >>
             ((byte)*(undefined4 *)(in_RDI + (long)local_34 * 0xa30 + 0x14) & 0x1f);
    iVar3 = *(int *)((long)in_stack_00000010->store_buf_adr +
                    (long)(int)(uint)(local_34 != 0) * 4 + -0x28);
    local_60 = in_EDX * iVar9 * iVar3 + in_ECX * iVar10;
    puVar7 = in_stack_00000010->store_buf_adr[(long)local_34 + -4];
    local_5c = 0;
    for (local_64 = 0; local_64 < iVar9; local_64 = local_64 + 1) {
      for (local_68 = 0; local_68 < iVar10; local_68 = local_68 + 1) {
        iVar11 = local_5c + local_30;
        iVar12 = (int)(uint)*(ushort *)(in_stack_00000008 + (long)iVar11 * 2) >> 1;
        if (iVar8 == 0) {
          if (*(ushort *)(in_stack_00000008 + (long)iVar11 * 2) < 0x400) {
            uVar4 = OD_DIVU_SMALL_CONSTS
                    [(int)(*(ushort *)(in_stack_00000008 + (long)iVar11 * 2) - 1)][0];
            iVar5 = *(int *)(in_R9 + (long)iVar11 * 4);
            uVar6 = OD_DIVU_SMALL_CONSTS
                    [(int)(*(ushort *)(in_stack_00000008 + (long)iVar11 * 2) - 1)][1];
            iVar11 = get_msb((uint)*(ushort *)(in_stack_00000008 + (long)iVar11 * 2));
            local_7c = (uint8_t)((uint)((ulong)uVar4 * (ulong)(uint)(iVar5 + iVar12) + (ulong)uVar6
                                       >> 0x20) >> ((byte)iVar11 & 0x1f));
          }
          else {
            local_7c = (uint8_t)((uint)(*(int *)(in_R9 + (long)iVar11 * 4) + iVar12) /
                                (uint)*(ushort *)(in_stack_00000008 + (long)iVar11 * 2));
          }
          puVar7[local_60] = local_7c;
        }
        else {
          if (*(ushort *)(in_stack_00000008 + (long)iVar11 * 2) < 0x400) {
            uVar4 = OD_DIVU_SMALL_CONSTS
                    [(int)(*(ushort *)(in_stack_00000008 + (long)iVar11 * 2) - 1)][0];
            iVar5 = *(int *)(in_R9 + (long)iVar11 * 4);
            uVar6 = OD_DIVU_SMALL_CONSTS
                    [(int)(*(ushort *)(in_stack_00000008 + (long)iVar11 * 2) - 1)][1];
            iVar11 = get_msb((uint)*(ushort *)(in_stack_00000008 + (long)iVar11 * 2));
            local_74 = (undefined2)
                       ((uint)((ulong)uVar4 * (ulong)(uint)(iVar5 + iVar12) + (ulong)uVar6 >> 0x20)
                       >> ((byte)iVar11 & 0x1f));
          }
          else {
            local_74 = (undefined2)
                       ((uint)(*(int *)(in_R9 + (long)iVar11 * 4) + iVar12) /
                       (uint)*(ushort *)(in_stack_00000008 + (long)iVar11 * 2));
          }
          *(undefined2 *)((long)puVar7 * 2 + (long)local_60 * 2) = local_74;
        }
        local_5c = local_5c + 1;
        local_60 = local_60 + 1;
      }
      local_60 = (iVar3 - iVar10) + local_60;
    }
    local_30 = iVar9 * iVar10 + local_30;
  }
  return;
}

Assistant:

static void tf_normalize_filtered_frame(
    const MACROBLOCKD *mbd, const BLOCK_SIZE block_size, const int mb_row,
    const int mb_col, const int num_planes, const uint32_t *accum,
    const uint16_t *count, YV12_BUFFER_CONFIG *result_buffer) {
  // Block information.
  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int is_high_bitdepth = is_frame_high_bitdepth(result_buffer);

  int plane_offset = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    const int plane_h = mb_height >> mbd->plane[plane].subsampling_y;
    const int plane_w = mb_width >> mbd->plane[plane].subsampling_x;
    const int frame_stride = result_buffer->strides[plane == 0 ? 0 : 1];
    const int frame_offset = mb_row * plane_h * frame_stride + mb_col * plane_w;
    uint8_t *const buf = result_buffer->buffers[plane];
    uint16_t *const buf16 = CONVERT_TO_SHORTPTR(buf);

    int plane_idx = 0;             // Pixel index on current plane (block-base).
    int frame_idx = frame_offset;  // Pixel index on the entire frame.
    for (int i = 0; i < plane_h; ++i) {
      for (int j = 0; j < plane_w; ++j) {
        const int idx = plane_idx + plane_offset;
        const uint16_t rounding = count[idx] >> 1;
        if (is_high_bitdepth) {
          buf16[frame_idx] =
              (uint16_t)OD_DIVU(accum[idx] + rounding, count[idx]);
        } else {
          buf[frame_idx] = (uint8_t)OD_DIVU(accum[idx] + rounding, count[idx]);
        }
        ++plane_idx;
        ++frame_idx;
      }
      frame_idx += (frame_stride - plane_w);
    }
    plane_offset += plane_h * plane_w;
  }
}